

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void lhash_page_release(void *pUserData)

{
  long lVar1;
  long lVar2;
  unqlite_page *puVar3;
  uint local_3c;
  sxu32 n;
  unqlite_page *pRaw;
  lhcell *pCell;
  lhcell *pNext;
  lhash_kv_engine *pEngine;
  lhpage *pPage;
  void *pUserData_local;
  
  lVar1 = *pUserData;
  lVar2 = *(long *)((long)pUserData + 8);
  pRaw = *(unqlite_page **)((long)pUserData + 0x28);
  for (local_3c = 0; local_3c < *(uint *)((long)pUserData + 0x38); local_3c = local_3c + 1) {
    puVar3 = (unqlite_page *)pRaw[4].zData;
    SyBlobRelease((SyBlob *)&pRaw[2].iPage);
    SyMemBackendPoolFree((SyMemBackend *)(lVar1 + 8),pRaw);
    pRaw = puVar3;
  }
  if (*(long *)((long)pUserData + 0x20) != 0) {
    SyMemBackendFree((SyMemBackend *)(lVar1 + 8),*(void **)((long)pUserData + 0x20));
  }
  SyMemBackendPoolFree((SyMemBackend *)(lVar1 + 8),pUserData);
  *(undefined8 *)(lVar2 + 8) = 0;
  return;
}

Assistant:

static void lhash_page_release(void *pUserData)
{
	lhpage *pPage = (lhpage *)pUserData;
	lhash_kv_engine *pEngine = pPage->pHash;
	lhcell *pNext,*pCell = pPage->pList;
	unqlite_page *pRaw = pPage->pRaw;
	sxu32 n;
	/* Drop in-memory cells */
	for( n = 0 ; n < pPage->nCell ; ++n ){
		pNext = pCell->pNext;
		SyBlobRelease(&pCell->sKey);
		/* Release the cell instance */
		SyMemBackendPoolFree(&pEngine->sAllocator,(void *)pCell);
		/* Point to the next entry */
		pCell = pNext;
	}
	if( pPage->apCell ){
		/* Release the cell table */
		SyMemBackendFree(&pEngine->sAllocator,(void *)pPage->apCell);
	}
	/* Finally, release the whole page */
	SyMemBackendPoolFree(&pEngine->sAllocator,pPage);
	pRaw->pUserData = 0;
}